

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

int outformatlen_stream(out_stream_info *stream,char *s,size_t slen)

{
  long *plVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uchar uVar4;
  ushort uVar5;
  char *pcVar6;
  _func_void_out_stream_info_ptr_char_ptr **pp_Var7;
  undefined8 uVar8;
  undefined1 *puVar9;
  char cVar10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  out_stream_info *poVar14;
  ulong uVar15;
  out_stream_info *extraout_RAX;
  undefined7 extraout_var;
  ushort *puVar16;
  ushort **ppuVar17;
  size_t sVar18;
  ulong uVar19;
  undefined7 extraout_var_00;
  undefined8 extraout_RAX_00;
  byte *pbVar20;
  undefined8 extraout_RAX_01;
  out_stream_info *extraout_RAX_02;
  out_stream_info *extraout_RAX_03;
  out_stream_info *extraout_RAX_04;
  out_stream_info *extraout_RAX_05;
  out_stream_info *extraout_RAX_06;
  out_stream_info *extraout_RAX_07;
  out_stream_info *extraout_RAX_08;
  out_stream_info *extraout_RAX_09;
  out_stream_info *extraout_RAX_10;
  out_stream_info *poVar21;
  uchar c;
  char *pcVar22;
  out_stream_info *in_R9;
  undefined1 *puVar23;
  ushort *puVar24;
  uint uVar25;
  out_stream_info *poVar26;
  long lVar27;
  undefined1 *puVar28;
  bool bVar29;
  out_stream_info *local_220;
  out_stream_info *local_218;
  out_stream_info *local_210;
  char local_205;
  uint local_204;
  int is_end_tag_1;
  undefined4 local_1fc;
  char fmsbuf [40];
  undefined1 local_1d0 [16];
  out_stream_info *local_1c0;
  char attrname [128];
  char fmsbuf_srch [40];
  byte abStack_39 [9];
  
  if ((G_recurse != 0) && (G_cur_stream != stream)) {
    return G_recurse;
  }
  G_recurse = G_recurse + 1;
  poVar14 = (out_stream_info *)(ulong)(uint)G_recurse;
  G_cur_stream = stream;
  if (slen == 0) goto LAB_00218547;
  local_210 = (out_stream_info *)(slen - 1);
  local_220 = (out_stream_info *)(s + 1);
  uVar19 = (ulong)(byte)*s;
  poVar14 = local_220;
  if (*s == 0) goto LAB_00218547;
  local_1d0._0_8_ = &stream->html_title_ptr;
  local_1d0._8_8_ = stream->html_title_buf;
  poVar14 = (out_stream_info *)-(long)fmsbuf;
  local_1c0 = poVar14;
  poVar26 = (out_stream_info *)0x0;
  bVar29 = false;
LAB_00217371:
  uVar8 = local_1d0._0_8_;
  cVar10 = (char)uVar19;
  if (bVar29) {
    uVar15 = CONCAT71((int7)((ulong)poVar14 >> 8),cVar10 == '\\');
    if ((poVar26 == (out_stream_info *)local_1d0 || cVar10 == '\\') ||
       ((stream->html_mode != 0 &&
        ((cVar10 == '<' || (uVar15 = uVar19 & 0xff, (int)uVar15 == 0x26)))))) {
      outchar_noxlat_stream(stream,G_cmap_output[0x25]);
      bVar29 = false;
      poVar14 = (out_stream_info *)fmsbuf;
      if (poVar14 < poVar26) {
        pcVar22 = local_1c0->linebuf;
        puVar28 = (undefined1 *)0x0;
        do {
          outchar_noxlat_stream(stream,G_cmap_output[(byte)fmsbuf[(long)puVar28]]);
          puVar28 = puVar28 + 1;
          poVar14 = extraout_RAX;
        } while (pcVar22 + (long)(poVar26->linebuf + -0x20) != puVar28);
        goto LAB_0021752f;
      }
      goto LAB_00217de1;
    }
    puVar16 = (ushort *)CONCAT71((int7)(uVar15 >> 8),cVar10 == '%');
    c = G_cmap_output[0x25];
    if (poVar26 == (out_stream_info *)fmsbuf && cVar10 == '%') {
LAB_00217493:
      outchar_noxlat_stream(stream,c);
LAB_0021749b:
      bVar29 = false;
      poVar21 = poVar26;
      goto LAB_00217dba;
    }
    if (cVar10 != '%') {
      *(char *)&poVar26->do_print = cVar10;
      bVar29 = true;
      poVar21 = (out_stream_info *)((long)&poVar26->do_print + 1);
      goto LAB_00217dba;
    }
    *(char *)&poVar26->do_print = '\0';
    lVar27 = (long)fmsbuf[0];
    bVar29 = true;
    local_218 = poVar26;
    if (lVar27 < 0) {
LAB_002174e0:
      local_1fc = (undefined4)CONCAT71((int7)((ulong)puVar16 >> 8),1);
    }
    else {
      ppuVar17 = __ctype_b_loc();
      puVar16 = *ppuVar17;
      if ((*(byte *)((long)puVar16 + lVar27 * 2 + 1) & 1) == 0) goto LAB_002174e0;
      if (0 < (long)fmsbuf[1]) {
        bVar29 = (*(byte *)((long)puVar16 + (long)fmsbuf[1] * 2 + 1) & 1) == 0;
      }
      local_1fc = 0;
    }
    strcpy(fmsbuf_srch,fmsbuf);
    os_strlwr(fmsbuf_srch);
    sVar18 = strlen(fmsbuf_srch);
    puVar16 = (ushort *)fmstop;
    puVar24 = (ushort *)fmsbase;
    poVar21 = local_218;
    if (fmsbase < fmstop) {
      local_205 = bVar29;
      do {
        uVar5 = puVar24[1];
        if ((uVar5 - 2 == (int)sVar18) &&
           (iVar12 = bcmp(puVar24 + 2,fmsbuf_srch,sVar18 & 0xffffffff), poVar21 = local_218,
           iVar12 == 0)) {
          uVar5 = *puVar24;
          uVar4 = stream->allcapsflag;
          if (local_205 == '\0') {
            stream->allcapsflag = '\x01';
            stream->capsflag = '\0';
            stream->nocapsflag = '\0';
          }
          else if ((char)local_1fc == '\0') {
            stream->capsflag = '\x01';
            stream->nocapsflag = '\0';
            stream->allcapsflag = '\0';
          }
          in_R9 = (out_stream_info *)(ulong)uVar5;
          runpprop(runctx,(uchar **)0x0,0,0,cmdActor,uVar5,0,0,cmdActor);
          stream->allcapsflag = uVar4;
          stream->capsflag = '\0';
          stream->nocapsflag = '\0';
          puVar16 = (ushort *)fmstop;
          break;
        }
        puVar24 = (ushort *)((long)puVar24 + (ulong)uVar5 + 2);
        poVar21 = local_218;
      } while (puVar24 < puVar16);
    }
    if (puVar24 == puVar16) {
      outchar_noxlat_stream(stream,G_cmap_output[0x25]);
      if ((out_stream_info *)fmsbuf < poVar21) {
        pcVar22 = local_1c0->linebuf;
        pcVar6 = local_218->linebuf;
        puVar28 = (undefined1 *)0x0;
        do {
          outchar_noxlat_stream(stream,G_cmap_output[(byte)fmsbuf[(long)puVar28]]);
          puVar28 = puVar28 + 1;
        } while (pcVar6 + (long)(pcVar22 + -0x20) != puVar28);
      }
      outchar_noxlat_stream(stream,G_cmap_output[0x25]);
      poVar21 = local_218;
    }
    bVar29 = false;
LAB_00217dba:
    poVar14 = local_210;
    poVar26 = poVar21;
    if (local_210 == (out_stream_info *)0x0) goto LAB_00218506;
    local_210 = (out_stream_info *)&local_210[-1].field_0x2977;
    uVar19 = (ulong)*(byte *)&local_220->do_print;
    poVar14 = local_220;
    local_220 = (out_stream_info *)((long)&local_220->do_print + 1);
  }
  else {
    local_218 = poVar26;
    switch(stream->html_mode_flag) {
    case 0:
      if ((cVar10 != '<') && (stream->html_in_ignore != 0)) {
        if (cVar10 == '&') {
          cVar10 = out_parse_entity(fmsbuf_srch,(size_t)&local_220,(char **)&local_210,
                                    (size_t *)&switchD_0021740b::switchdataD_002cc2b0);
          uVar15 = CONCAT71(extraout_var,cVar10) & 0xffffffff;
          uVar19 = (ulong)(byte)fmsbuf_srch[0];
          poVar14 = (out_stream_info *)CONCAT71(extraout_var,cVar10);
        }
        else {
          fmsbuf_srch[0] = cVar10;
          fmsbuf_srch[1] = '\0';
          if (local_210 == (out_stream_info *)0x0) {
            uVar15 = 0;
            poVar14 = local_210;
          }
          else {
            local_210 = (out_stream_info *)&local_210[-1].field_0x2977;
            uVar15 = (ulong)*(byte *)&local_220->do_print;
            poVar14 = local_220;
            local_220 = (out_stream_info *)((long)&local_220->do_print + 1);
          }
        }
        if ((stream->html_in_title != 0) && ((char)uVar19 != '\0')) {
          poVar14 = (out_stream_info *)(fmsbuf_srch + 1);
          do {
            pcVar22 = *(char **)uVar8;
            plVar1 = (long *)(pcVar22 + 1);
            if (plVar1 < (ulong)uVar8) {
              *(long **)uVar8 = plVar1;
              *pcVar22 = (char)uVar19;
            }
            pp_Var7 = &poVar14->do_print;
            uVar19 = (ulong)*(byte *)pp_Var7;
            poVar14 = (out_stream_info *)((long)&poVar14->do_print + 1);
          } while (*(byte *)pp_Var7 != 0);
        }
LAB_0021794d:
        uVar19 = uVar15;
        bVar29 = false;
        poVar26 = local_218;
        goto LAB_00217de1;
      }
      if (cVar10 == '%') {
        bVar29 = true;
        poVar21 = (out_stream_info *)fmsbuf;
        goto LAB_00217dba;
      }
      iVar12 = (int)(uVar19 & 0xff);
      if (iVar12 != 0x5c) {
        uVar13 = stream->html_mode;
        if (stream->html_target == 0) {
          if (uVar13 != 0) {
            if (cVar10 == '&') {
              cVar10 = out_parse_entity(fmsbuf_srch,(size_t)&local_220,(char **)&local_210,
                                        (size_t *)(ulong)uVar13);
              uVar15 = CONCAT71(extraout_var_00,cVar10) & 0xffffffff;
              poVar14 = (out_stream_info *)CONCAT71(extraout_var_00,fmsbuf_srch[0]);
              if (fmsbuf_srch[0] != '\0') {
                pcVar22 = fmsbuf_srch;
                do {
                  pcVar22 = pcVar22 + 1;
                  outchar_noxlat_stream(stream,(char)poVar14);
                  poVar14 = (out_stream_info *)
                            CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),*pcVar22);
                } while (*pcVar22 != '\0');
              }
              goto LAB_0021794d;
            }
            if (iVar12 == 0x3c) {
              bVar11 = read_tag(attrname,(size_t)&is_end_tag_1,(int *)&local_220,(char **)&local_210
                                ,(size_t *)0x0,in_R9);
              uVar19 = (ulong)bVar11;
              uVar13 = stricmp(attrname,"br");
              poVar14 = (out_stream_info *)(ulong)uVar13;
              if (uVar13 == 0) {
                if (stream->html_in_ignore == 0) {
                  if (stream->linepos == '\0') {
                    stream->html_defer_br = 2;
                  }
                  else {
                    stream->html_defer_br = 1;
                  }
                }
              }
              else {
                iVar12 = stricmp(attrname,"b");
                if ((((iVar12 == 0) || (iVar12 = stricmp(attrname,"i"), iVar12 == 0)) ||
                    (iVar12 = stricmp(attrname,"em"), iVar12 == 0)) ||
                   (iVar12 = stricmp(attrname,"strong"), iVar12 == 0)) {
                  poVar14 = (out_stream_info *)(ulong)(byte)attrname[0];
                  uVar13 = attrname._0_4_ & 0xff;
                  if ((attrname._0_4_ & 0xff) < 0x62) {
                    uVar25 = attrname._0_4_ & 0xff;
                    if (uVar25 < 0x49) {
                      if ((uVar13 == 0x42) || (uVar25 == 0x45)) {
LAB_002181ce:
                        local_204 = 1;
                      }
                    }
                    else if (uVar25 == 0x49) {
LAB_0021829c:
                      local_204 = 2;
                    }
                    else if (uVar13 == 0x53) {
LAB_00218292:
                      local_204 = 0;
                    }
                  }
                  else if ((attrname._0_4_ & 0xff) < 0x69) {
                    if ((uVar13 == 0x62) || (uVar13 == 0x65)) goto LAB_002181ce;
                  }
                  else {
                    if (uVar13 == 0x69) goto LAB_0021829c;
                    if (uVar13 == 0x73) goto LAB_00218292;
                  }
                  if (stream->html_in_ignore == 0) {
                    if (is_end_tag_1 == 0) {
                      poVar14 = (out_stream_info *)(ulong)local_204;
                      stream->cur_attr = stream->cur_attr | local_204;
                    }
                    else {
                      poVar14 = (out_stream_info *)(ulong)~local_204;
                      stream->cur_attr = stream->cur_attr & ~local_204;
                    }
                  }
                }
                else {
                  uVar13 = stricmp(attrname,"p");
                  poVar14 = (out_stream_info *)(ulong)uVar13;
                  if (uVar13 == 0) {
                    if (stream->html_in_ignore == 0) {
                      outblank_stream(stream);
                      poVar14 = extraout_RAX_03;
                    }
                  }
                  else {
                    uVar13 = stricmp(attrname,"tab");
                    poVar14 = (out_stream_info *)(ulong)uVar13;
                    if (uVar13 == 0) {
                      if (stream->html_in_ignore == 0) {
                        outtab_stream(stream);
                        poVar14 = extraout_RAX_04;
                      }
                    }
                    else {
                      uVar13 = stricmp(attrname,"img");
                      if ((uVar13 == 0) || (uVar13 = stricmp(attrname,"sound"), uVar13 == 0)) {
                        poVar14 = (out_stream_info *)(ulong)uVar13;
                        stream->html_allow_alt = 1;
                      }
                      else {
                        uVar13 = stricmp(attrname,"hr");
                        poVar14 = (out_stream_info *)(ulong)uVar13;
                        if (uVar13 == 0) {
                          poVar26 = local_218;
                          if (stream->html_in_ignore == 0) {
                            outflushn_stream(stream,1);
                            if (1 < G_os_linewidth) {
                              uVar13 = G_os_linewidth - 1;
                              do {
                                sVar18 = 99;
                                if (uVar13 < 99) {
                                  sVar18 = (size_t)uVar13;
                                }
                                memset(fmsbuf_srch,0x5f,sVar18);
                                fmsbuf_srch[sVar18] = '\0';
                                if (fmsbuf_srch[0] != '\0') {
                                  pbVar20 = (byte *)fmsbuf_srch;
                                  bVar11 = fmsbuf_srch[0];
                                  do {
                                    pbVar20 = pbVar20 + 1;
                                    outchar_noxlat_stream(stream,G_cmap_output[bVar11]);
                                    bVar11 = *pbVar20;
                                  } while (bVar11 != 0);
                                }
                                uVar25 = uVar13 - (int)sVar18;
                                bVar29 = (int)sVar18 <= (int)uVar13;
                                uVar13 = uVar25;
                              } while (uVar25 != 0 && bVar29);
                            }
LAB_002183c3:
                            outblank_stream(stream);
                            poVar14 = extraout_RAX_05;
                            poVar26 = local_218;
                          }
                        }
                        else {
                          uVar13 = stricmp(attrname,"q");
                          poVar14 = (out_stream_info *)(ulong)uVar13;
                          if (uVar13 == 0) {
                            poVar26 = local_218;
                            if (stream->html_in_ignore == 0) {
                              uVar13 = stream->html_quote_level;
                              if (is_end_tag_1 == 0) {
                                stream->html_quote_level = uVar13 + 1;
                                outchar_html_stream(stream,(uint)((uVar13 & 1) == 0) * 4 + 0x2018);
                                poVar14 = extraout_RAX_08;
                                poVar26 = local_218;
                              }
                              else {
                                outchar_html_stream(stream,(uVar13 & 1) * 4 + 0x2019);
                                stream->html_quote_level = stream->html_quote_level + -1;
                                poVar14 = extraout_RAX_06;
                                poVar26 = local_218;
                              }
                            }
                          }
                          else {
                            iVar12 = stricmp(attrname,"title");
                            if (iVar12 == 0) {
                              poVar26 = local_218;
                              if (is_end_tag_1 == 0) {
                                iVar12 = stream->html_in_title;
                                if (iVar12 == 0) {
                                  *(undefined8 *)local_1d0._0_8_ = local_1d0._8_8_;
                                }
                                stream->html_in_ignore = stream->html_in_ignore + 1;
                                uVar13 = iVar12 + 1;
                                poVar14 = (out_stream_info *)(ulong)uVar13;
                                stream->html_in_title = uVar13;
                              }
                              else {
                                uVar2 = stream->html_in_ignore;
                                uVar3 = stream->html_in_title;
                                uVar13 = uVar3 - 1;
                                stream->html_in_ignore = uVar2 + -1;
                                stream->html_in_title = uVar13;
                                poVar14 = (out_stream_info *)(ulong)uVar13;
                                if (uVar13 == 0) {
                                  **(char **)local_1d0._0_8_ = '\0';
                                  os_set_title((char *)local_1d0._8_8_);
                                  poVar14 = extraout_RAX_07;
                                  poVar26 = local_218;
                                }
                              }
                            }
                            else {
                              iVar12 = stricmp(attrname,"aboutbox");
                              if (iVar12 == 0) {
                                if (is_end_tag_1 == 0) {
                                  uVar13 = stream->html_in_ignore + 1;
                                }
                                else {
                                  uVar13 = stream->html_in_ignore - 1;
                                }
                                poVar14 = (out_stream_info *)(ulong)uVar13;
                                stream->html_in_ignore = uVar13;
                                poVar26 = local_218;
                              }
                              else {
                                uVar13 = stricmp(attrname,"pre");
                                poVar14 = (out_stream_info *)(ulong)uVar13;
                                poVar26 = local_218;
                                if (uVar13 == 0) {
                                  if (is_end_tag_1 == 0) {
                                    stream->html_pre_level = stream->html_pre_level + 1;
                                    goto LAB_002183c3;
                                  }
                                  outblank_stream(stream);
                                  uVar13 = stream->html_pre_level;
                                  poVar14 = (out_stream_info *)(ulong)uVar13;
                                  poVar26 = local_218;
                                  if (uVar13 != 0) {
                                    poVar14 = (out_stream_info *)(ulong)(uVar13 - 1);
                                    stream->html_pre_level = uVar13 - 1;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              stream->html_mode_flag = 1;
              goto LAB_0021752f;
            }
          }
        }
        else if (cVar10 == '<' && uVar13 != 0) {
          bVar11 = read_tag(fmsbuf_srch,(size_t)attrname,(int *)&local_220,(char **)&local_210,
                            (size_t *)stream,in_R9);
          iVar12 = stricmp(fmsbuf_srch,"pre");
          if (iVar12 == 0) {
            if (attrname._0_4_ == 0) {
              iVar12 = 1;
            }
            else {
              iVar12 = -1;
              if (stream->html_pre_level == 0) goto LAB_00217f0f;
            }
            stream->html_pre_level = stream->html_pre_level + iVar12;
          }
LAB_00217f0f:
          poVar26 = local_218;
          if (bVar11 != 0) {
            poVar14 = (out_stream_info *)(ulong)bVar11;
LAB_00217f21:
            c = (uchar)poVar14[0x15a].attrbuf[0x138];
            goto LAB_00217493;
          }
          goto LAB_0021749b;
        }
        c = G_cmap_output[uVar19 & 0xff];
        goto LAB_00217493;
      }
      if (local_210 == (out_stream_info *)0x0) {
        puVar28 = (undefined1 *)0x0;
        bVar11 = 0;
      }
      else {
        puVar28 = &local_210[-1].field_0x2977;
        bVar11 = *(byte *)&local_220->do_print;
        local_220 = (out_stream_info *)((long)&local_220->do_print + 1);
        local_210 = (out_stream_info *)puVar28;
      }
      if ((((stream->capturing == 0) || (bVar11 == 0)) || (bVar11 == 0x5e)) || (bVar11 == 0x76)) {
        poVar14 = (out_stream_info *)(ulong)bVar11;
        if (0x5d < bVar11) {
          if (bVar11 < 0x6e) {
            if (bVar11 == 0x5e) {
              stream->capsflag = '\x01';
              stream->nocapsflag = '\0';
            }
            else {
              if (bVar11 != 0x62) goto LAB_00217f21;
              outblank_stream(stream);
            }
          }
          else if (bVar11 == 0x6e) {
            outflushn_stream(stream,1);
          }
          else if (bVar11 == 0x74) {
            outtab_stream(stream);
          }
          else {
            if (bVar11 != 0x76) goto LAB_00217f21;
            stream->capsflag = '\0';
            stream->nocapsflag = '\x01';
          }
          goto LAB_0021749b;
        }
        if (bVar11 < 0x29) {
          if (bVar11 == 0x20) {
            c = G_cmap_output[0x1a];
            if ((stream->html_target == 0) || (stream->html_mode == 0)) goto LAB_00217493;
            pcVar22 = "&nbsp;";
          }
          else {
            if (bVar11 != 0x28) {
              if (bVar11 != 0) goto LAB_00217f21;
              goto LAB_00218547;
            }
            if ((stream->html_mode == 0) || (stream->html_target == 0)) {
              *(byte *)&stream->cur_attr = (byte)stream->cur_attr | 1;
              goto LAB_0021749b;
            }
            pcVar22 = "<B>";
          }
LAB_00217ee6:
          outstring_stream(stream,pcVar22);
        }
        else {
          if (bVar11 != 0x29) {
            if (bVar11 == 0x2d) {
              if (puVar28 == (undefined1 *)0x0) {
                puVar28 = (undefined1 *)0x0;
                uVar19 = 0;
              }
              else {
                puVar28 = puVar28 + -1;
                uVar19 = (ulong)*(byte *)&local_220->do_print;
                local_220 = (out_stream_info *)((long)&local_220->do_print + 1);
                local_210 = (out_stream_info *)puVar28;
              }
              outchar_noxlat_stream(stream,G_cmap_output[uVar19]);
              if (puVar28 == (undefined1 *)0x0) {
                poVar14 = (out_stream_info *)0x0;
              }
              else {
                local_210 = (out_stream_info *)(puVar28 + -1);
                poVar14 = (out_stream_info *)(ulong)*(byte *)&local_220->do_print;
                local_220 = (out_stream_info *)((long)&local_220->do_print + 1);
              }
            }
            else if (bVar11 == 0x48) {
              if (puVar28 == (undefined1 *)0x0) {
                iVar12 = stream->html_target;
                bVar11 = 0;
              }
              else {
                local_210 = (out_stream_info *)(puVar28 + -1);
                poVar14 = (out_stream_info *)((long)&local_220->do_print + 1);
                bVar11 = *(byte *)&local_220->do_print;
                iVar12 = stream->html_target;
                local_220 = poVar14;
                if (bVar11 == 0x2d) {
                  if (iVar12 != 0) {
                    outflushn_stream(stream,0);
                  }
                  stream->html_mode = 0;
                  goto LAB_0021749b;
                }
              }
              if (iVar12 != 0) {
                outflushn_stream(stream,0);
              }
              stream->html_mode = 1;
              if ((bVar11 != 0) && (bVar11 != 0x2b)) {
                outchar_noxlat_stream(stream,G_cmap_output[bVar11]);
              }
              goto LAB_00217cae;
            }
            goto LAB_00217f21;
          }
          if ((stream->html_mode != 0) && (stream->html_target != 0)) {
            pcVar22 = "</B>";
            goto LAB_00217ee6;
          }
          *(byte *)&stream->cur_attr = (byte)stream->cur_attr & 0xfe;
        }
        goto LAB_0021749b;
      }
      outchar_noxlat_stream(stream,G_cmap_output[0x5c]);
      outchar_noxlat_stream(stream,G_cmap_output[bVar11]);
      poVar21 = local_218;
      bVar29 = false;
      if (bVar11 == 0x2d) {
        if (puVar28 == (undefined1 *)0x0) {
          puVar28 = (undefined1 *)0x0;
          uVar19 = 0;
        }
        else {
          puVar28 = puVar28 + -1;
          uVar19 = (ulong)*(byte *)&local_220->do_print;
          local_220 = (out_stream_info *)((long)&local_220->do_print + 1);
          local_210 = (out_stream_info *)puVar28;
        }
        outchar_noxlat_stream(stream,G_cmap_output[uVar19]);
        if (puVar28 == (undefined1 *)0x0) {
          uVar19 = 0;
        }
        else {
          local_210 = (out_stream_info *)(puVar28 + -1);
          uVar19 = (ulong)*(byte *)&local_220->do_print;
          local_220 = (out_stream_info *)((long)&local_220->do_print + 1);
        }
        outchar_noxlat_stream(stream,G_cmap_output[uVar19]);
      }
      else {
LAB_00217cae:
        bVar29 = false;
        poVar21 = local_218;
      }
      goto LAB_00217dba;
    case 1:
      if (cVar10 == '\"') {
        stream->html_mode_flag = 3;
      }
      else {
        iVar12 = (int)(uVar19 & 0xff);
        if (iVar12 == 0x27) {
          stream->html_mode_flag = 2;
        }
        else if (iVar12 == 0x3e) {
          stream->html_mode_flag = 0;
          if (stream->html_defer_br == 2) {
            outblank_stream(stream);
          }
          else if (stream->html_defer_br == 1) {
            outflushn_stream(stream,1);
          }
          stream->html_defer_br = 0;
          stream->html_allow_alt = 0;
        }
        else if ((-1 < cVar10) &&
                (ppuVar17 = __ctype_b_loc(), poVar26 = local_218,
                (*(byte *)((long)*ppuVar17 + (uVar19 & 0xff) * 2 + 1) & 4) != 0)) {
          lVar27 = 0;
          do {
            uVar13 = (uint)uVar19;
            if (lVar27 == 0x7f) break;
            attrname[lVar27] = (char)uVar19;
            if (local_210 == (out_stream_info *)0x0) {
              local_210 = (out_stream_info *)0x0;
              uVar19 = 0;
            }
            else {
              local_210 = (out_stream_info *)&local_210[-1].field_0x2977;
              bVar11 = *(byte *)&local_220->do_print;
              uVar19 = (ulong)bVar11;
              uVar13 = (uint)bVar11;
              local_220 = (out_stream_info *)((long)&local_220->do_print + 1);
              if ((char)bVar11 < '\0') {
                attrname[lVar27 + 1] = '\0';
                goto LAB_00217cfe;
              }
            }
            uVar13 = (uint)uVar19;
            lVar27 = lVar27 + 1;
          } while ((*(byte *)((long)*ppuVar17 + uVar19 * 2 + 1) & 0xc) != 0);
          attrname[lVar27] = '\0';
          if ((char)uVar13 == '=') {
            uVar13 = 0;
            if (local_210 == (out_stream_info *)0x0) {
              puVar28 = (undefined1 *)0x0;
              uVar19 = 0;
              poVar14 = local_220;
            }
            else {
              puVar28 = &local_210[-1].field_0x2977;
              poVar14 = (out_stream_info *)((long)&local_220->do_print + 1);
              bVar11 = *(byte *)&local_220->do_print;
              uVar19 = (ulong)bVar11;
              if ((bVar11 == 0x27) || (bVar11 == 0x22)) {
                if (puVar28 == (undefined1 *)0x0) {
                  puVar28 = (undefined1 *)0x0;
                  uVar25 = 0;
                }
                else {
                  puVar28 = &local_210[-1].field_0x2976;
                  poVar14 = (out_stream_info *)((long)&local_220->do_print + 2);
                  uVar25 = (uint)*(byte *)((long)&local_220->do_print + 1);
                }
                uVar13 = (uint)bVar11;
                uVar19 = (ulong)uVar25;
              }
            }
            in_R9 = (out_stream_info *)(puVar28 + -0xff);
            puVar9 = (undefined1 *)0x0;
            local_210 = (out_stream_info *)puVar28;
            do {
              puVar23 = puVar9;
              local_210 = (out_stream_info *)((long)local_210 + -1);
              fmsbuf_srch[(long)puVar23] = (char)uVar19;
              if (puVar28 == puVar23) {
                poVar21 = (out_stream_info *)(poVar14->linebuf + (long)(puVar23 + -0x10));
                local_210 = (out_stream_info *)0x0;
LAB_00218024:
                pbVar20 = (byte *)(fmsbuf_srch + 1 + (long)puVar23);
                if (uVar13 == 0x27) {
                  stream->html_mode_flag = 2;
                }
                else if (uVar13 == 0x22) {
                  stream->html_mode_flag = 3;
                }
                else {
                  stream->html_mode_flag = 1;
                }
                uVar19 = 0;
                local_220 = poVar21;
                goto LAB_002180c4;
              }
              uVar25 = (uint)poVar14->linebuf[(long)(puVar23 + -0x10)];
              uVar19 = (ulong)uVar25;
              if (uVar25 == 0) {
                poVar21 = (out_stream_info *)(poVar14->linebuf + (long)(puVar23 + -0xf));
                goto LAB_00218024;
              }
              if (uVar13 == 0) {
                if ((poVar14->linebuf[(long)(puVar23 + -0x10)] < '\0') ||
                   ((*(byte *)((long)*ppuVar17 + (long)(int)uVar25 * 2 + 1) & 0xc) == 0)) {
                  local_220 = (out_stream_info *)(poVar14->linebuf + (long)(puVar23 + -0xf));
                  pbVar20 = (byte *)(fmsbuf_srch + 1 + (long)puVar23);
                  goto LAB_002180ee;
                }
              }
              else if (uVar13 == uVar25) {
                poVar21 = (out_stream_info *)(poVar14->linebuf + (long)(puVar23 + -0xf));
                pbVar20 = (byte *)(fmsbuf_srch + 1 + (long)puVar23);
                local_220 = poVar21;
                goto LAB_002180c4;
              }
              puVar9 = puVar23 + 1;
            } while (puVar23 + 1 != (undefined1 *)0xff);
            pbVar20 = abStack_39;
            poVar21 = (out_stream_info *)(poVar14->linebuf + (long)(puVar23 + -0xf));
            local_220 = (out_stream_info *)(poVar14->linebuf + 0xef);
            local_210 = in_R9;
LAB_002180c4:
            if ((uVar13 != 0) && (uVar13 == (int)(char)uVar19)) {
              if (local_210 == (out_stream_info *)0x0) {
                uVar19 = 0;
              }
              else {
                local_210 = (out_stream_info *)&local_210[-1].field_0x2977;
                local_220 = (out_stream_info *)((long)&poVar21->do_print + 1);
                uVar19 = (ulong)*(byte *)&poVar21->do_print;
              }
            }
LAB_002180ee:
            *pbVar20 = 0;
          }
          else {
LAB_00217cfe:
            fmsbuf_srch[0] = '\0';
            uVar19 = (ulong)uVar13;
          }
          iVar12 = stricmp(attrname,"height");
          if ((iVar12 == 0) && (stream->html_defer_br != 0)) {
            uVar13 = atoi(fmsbuf_srch);
            poVar14 = (out_stream_info *)(ulong)uVar13;
            if (uVar13 == 0) {
              stream->html_defer_br = 1;
            }
            else if (1 < (int)uVar13) {
              uVar13 = uVar13 + 1;
              do {
                outblank_stream(stream);
                uVar13 = uVar13 - 1;
                poVar14 = extraout_RAX_02;
              } while (1 < uVar13);
            }
          }
          else {
            uVar13 = stricmp(attrname,"alt");
            poVar14 = (out_stream_info *)(ulong)uVar13;
            if ((uVar13 == 0) &&
               ((stream->html_in_ignore == 0 &&
                (poVar14 = (out_stream_info *)(ulong)(byte)fmsbuf_srch[0],
                fmsbuf_srch[0] != '\0' && stream->html_allow_alt != 0)))) {
              pcVar22 = fmsbuf_srch;
              do {
                pcVar22 = pcVar22 + 1;
                outchar_noxlat_stream(stream,G_cmap_output[(ulong)poVar14 & 0xff]);
                poVar14 = (out_stream_info *)CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),*pcVar22);
              } while (*pcVar22 != '\0');
            }
          }
          bVar29 = false;
          goto LAB_00217de1;
        }
      }
      break;
    case 2:
      if (cVar10 == '\'') {
LAB_002174f9:
        stream->html_mode_flag = 1;
      }
      break;
    case 3:
      if (cVar10 == '\"') goto LAB_002174f9;
    }
    poVar14 = local_210;
    if (local_210 == (out_stream_info *)0x0) goto LAB_00218547;
    local_210 = (out_stream_info *)&local_210[-1].field_0x2977;
    uVar19 = (ulong)*(byte *)&local_220->do_print;
    poVar14 = local_220;
    poVar26 = local_218;
    local_220 = (out_stream_info *)((long)&local_220->do_print + 1);
LAB_0021752f:
    bVar29 = false;
  }
LAB_00217de1:
  if ((char)uVar19 == '\0') goto LAB_00218506;
  goto LAB_00217371;
LAB_00218506:
  if (bVar29) {
    outchar_noxlat_stream(stream,G_cmap_output[0x25]);
    poVar21 = (out_stream_info *)fmsbuf;
    poVar14 = extraout_RAX_09;
    if (poVar21 < poVar26) {
      do {
        outchar_noxlat_stream(stream,G_cmap_output[*(byte *)&poVar21->do_print]);
        poVar21 = (out_stream_info *)((long)&poVar21->do_print + 1);
        poVar14 = extraout_RAX_10;
      } while (poVar21 != poVar26);
    }
  }
LAB_00218547:
  G_recurse = G_recurse + -1;
  return (int)poVar14;
}

Assistant:

static int outformatlen_stream(out_stream_info *stream,
                               char *s, size_t slen)
{
    char     c;
    int      done = 0;
    char     fmsbuf[40];       /* space for constructing translation string */
    uint     fmslen;
    char    *f = 0;
    char    *f1;
    int      infmt = 0;

    /* 
     *   This routine can recurse because of format strings ("%xxx%"
     *   sequences).  When we recurse, we want to ensure that the
     *   recursion is directed to the original stream only.  So, note the
     *   current stream statically in case we re-enter the formatter. 
     */
    if (!out_push_stream(stream))
        return 0;

    /* get the first character */
    c = nextout(&s, &slen);

    /* if we have anything to show, show it */
    while (c != '\0')
    {
        /* check if we're collecting translation string */
        if (infmt)
        {
            /*
             *   if the string is too long for our buffer, or we've come
             *   across a backslash (illegal in a format string), or we've
             *   come across an HTML-significant character ('&' or '<') in
             *   HTML mode, we must have a stray percent sign; dump the
             *   whole string so far and act as though we have no format
             *   string 
             */
            if (c == '\\'
                || f == &fmsbuf[sizeof(fmsbuf)]
                || (stream->html_mode && (c == '<' || c == '&')))
            {
                outchar_stream(stream, '%');
                for (f1 = fmsbuf ; f1 < f ; ++f1)
                    outchar_stream(stream, *f1);
                infmt = 0;

                /* process this character again */
                continue;
            }
            else if (c == '%' && f == fmsbuf)       /* double percent sign? */
            {
                outchar_stream(stream, '%');       /* send out a single '%' */
                infmt = 0;       /* no longer processing translation string */
            }
            else if (c == '%')   /* found end of string? translate it if so */
            {
                uchar *fms;
                int    initcap = FALSE;
                int    allcaps = FALSE;
                char   fmsbuf_srch[sizeof(fmsbuf)];

                /* null-terminate the string */
                *f = '\0';

                /* check for an init cap */
                if (outisup(fmsbuf[0]))
                {
                    /* 
                     *   note the initial capital, so that we follow the
                     *   original capitalization in the substituted string 
                     */
                    initcap = TRUE;

                    /* 
                     *   if the second letter is capitalized as well,
                     *   capitalize the entire substituted string 
                     */
                    if (fmsbuf[1] != '\0' && outisup(fmsbuf[1]))
                    {
                        /* use all caps */
                        allcaps = TRUE;
                    }
                }

                /* convert the entire string to lower case for searching */
                strcpy(fmsbuf_srch, fmsbuf);
                os_strlwr(fmsbuf_srch);
                
                /* find the string in the format string table */
                fmslen = strlen(fmsbuf_srch);
                for (fms = fmsbase ; fms < fmstop ; )
                {
                    uint propnum;
                    uint len;

                    /* get the information on this entry */
                    propnum = osrp2(fms);
                    len = osrp2(fms + 2) - 2;

                    /* check for a match */
                    if (len == fmslen &&
                        !memcmp(fms + 4, fmsbuf_srch, (size_t)len))
                    {
                        int old_all_caps;

                        /* note the current ALLCAPS mode */
                        old_all_caps = stream->allcapsflag;
                        
                        /* 
                         *   we have a match - set the appropriate
                         *   capitalization mode 
                         */
                        if (allcaps)
                            outallcaps_stream(stream, TRUE);
                        else if (initcap)
                            outcaps_stream(stream);

                        /* 
                         *   evaluate the associated property to generate
                         *   the substitution text 
                         */
                        runppr(runctx, cmdActor, (prpnum)propnum, 0);

                        /* turn off ALLCAPS mode */
                        outallcaps_stream(stream, old_all_caps);

                        /* no need to look any further */
                        break;
                    }

                    /* move on to next formatstring if not yet found */
                    fms += len + 4;
                }

                /* if we can't find it, dump the format string as-is */
                if (fms == fmstop)
                {
                    outchar_stream(stream, '%');
                    for (f1 = fmsbuf ; f1 < f ; ++f1)
                        outchar_stream(stream, *f1);
                    outchar_stream(stream, '%');
                }

                /* no longer reading format string */
                infmt = 0;
            }
            else
            {
                /* copy this character of the format string */
                *f++ = c;
            }

            /* move on to the next character and continue scanning */
            c = nextout(&s, &slen);
            continue;
        }
        
        /*
         *   If we're parsing HTML here, and we're inside a tag, skip
         *   characters until we reach the end of the tag.  
         */
        if (stream->html_mode_flag != HTML_MODE_NORMAL)
        {
            switch(stream->html_mode_flag)
            {
            case HTML_MODE_TAG:
                /* 
                 *   keep skipping up to the closing '>', but note when we
                 *   enter any quoted section 
                 */
                switch(c)
                {
                case '>':
                    /* we've reached the end of the tag */
                    stream->html_mode_flag = HTML_MODE_NORMAL;

                    /* if we have a deferred <BR>, process it now */
                    switch(stream->html_defer_br)
                    {
                    case HTML_DEFER_BR_NONE:
                        /* no deferred <BR> */
                        break;

                    case HTML_DEFER_BR_FLUSH:
                        outflushn_stream(stream, 1);
                        break;

                    case HTML_DEFER_BR_BLANK:
                        outblank_stream(stream);
                        break;
                    }

                    /* no more deferred <BR> pending */
                    stream->html_defer_br = HTML_DEFER_BR_NONE;

                    /* no more ALT attribute allowed */
                    stream->html_allow_alt = FALSE;
                    break;

                case '"':
                    /* enter a double-quoted string */
                    stream->html_mode_flag = HTML_MODE_DQUOTE;
                    break;

                case '\'':
                    /* enter a single-quoted string */
                    stream->html_mode_flag = HTML_MODE_SQUOTE;
                    break;

                default:
                    /* if it's alphabetic, note the attribute name */
                    if (outisal(c))
                    {
                        char attrname[128];
                        char attrval[256];
                        char *dst;

                        /* gather up the attribute name */
                        for (dst = attrname ;
                             dst + 1 < attrname + sizeof(attrname) ; )
                        {
                            /* store this character */
                            *dst++ = c;

                            /* get the next character */
                            c = nextout(&s, &slen);

                            /* if it's not alphanumeric, stop scanning */
                            if (!outisal(c) && !outisdg(c))
                                break;
                        }

                        /* null-terminate the result */
                        *dst++ = '\0';

                        /* gather the value if present */
                        if (c == '=')
                        {
                            char qu;
                            
                            /* skip the '=' */
                            c = nextout(&s, &slen);

                            /* if we have a quote, so note */
                            if (c == '"' || c == '\'')
                            {
                                /* remember the quote */
                                qu = c;

                                /* skip it */
                                c = nextout(&s, &slen);
                            }
                            else
                            {
                                /* no quote */
                                qu = 0;
                            }

                            /* read the value */
                            for (dst = attrval ;
                                 dst + 1 < attrval + sizeof(attrval) ; )
                            {
                                /* store this character */
                                *dst++ = c;

                                /* read the next one */
                                c = nextout(&s, &slen);
                                if (c == '\0')
                                {
                                    /* 
                                     *   we've reached the end of the
                                     *   string, and we're still inside
                                     *   this attribute - abandon the
                                     *   attribute but note that we're
                                     *   inside a quoted string if
                                     *   necessary 
                                     */
                                    if (qu == '"')
                                        stream->html_mode_flag =
                                            HTML_MODE_DQUOTE;
                                    else if (qu == '\'')
                                        stream->html_mode_flag =
                                            HTML_MODE_SQUOTE;
                                    else
                                        stream->html_mode_flag
                                            = HTML_MODE_TAG;

                                    /* stop scanning the string */
                                    break;
                                }

                                /* 
                                 *   if we're looking for a quote, check
                                 *   for the closing quote; otherwise,
                                 *   check for alphanumerics 
                                 */
                                if (qu != 0)
                                {
                                    /* if this is our quote, stop scanning */
                                    if (c == qu)
                                        break;
                                }
                                else
                                {
                                    /* if it's non-alphanumeric, we're done */
                                    if (!outisal(c) && !outisdg(c))
                                        break;
                                }
                            }

                            /* skip the closing quote, if necessary */
                            if (qu != 0 && c == qu)
                                c = nextout(&s, &slen);

                            /* null-terminate the value string */
                            *dst = '\0';
                        }
                        else
                        {
                            /* no value */
                            attrval[0] = '\0';
                        }

                        /* 
                         *   see if we recognize it, and it's meaningful
                         *   in the context of the current tag 
                         */
                        if (!stricmp(attrname, "height")
                            && stream->html_defer_br != HTML_DEFER_BR_NONE)
                        {
                            int ht;
                                
                            /*
                             *   If the height is zero, always treat this
                             *   as a non-blanking flush.  If it's one,
                             *   treat it as we originally planned to.  If
                             *   it's greater than one, add n blank lines.
                             */
                            ht = atoi(attrval);
                            if (ht == 0)
                            {
                                /* always use non-blanking flush */
                                stream->html_defer_br = HTML_DEFER_BR_FLUSH;
                            }
                            else if (ht == 1)
                            {
                                /* keep original setting */
                            }
                            else
                            {
                                for ( ; ht > 0 ; --ht)
                                    outblank_stream(stream);
                            }
                        }
                        else if (!stricmp(attrname, "alt")
                                 && !stream->html_in_ignore
                                 && stream->html_allow_alt)
                        {
                            /* write out the ALT string */
                            outstring_stream(stream, attrval);
                        }

                        /* 
                         *   since we already read the next character,
                         *   simply loop back immediately 
                         */
                        continue;
                    }
                    break;
                }
                break;

            case HTML_MODE_DQUOTE:
                /* if we've reached the closing quote, return to tag state */
                if (c == '"')
                    stream->html_mode_flag = HTML_MODE_TAG;
                break;

            case HTML_MODE_SQUOTE:
                /* if we've reached the closing quote, return to tag state */
                if (c == '\'')
                    stream->html_mode_flag = HTML_MODE_TAG;
                break;
            }

            /* 
             *   move on to the next character, and start over with the
             *   new character 
             */
            c = nextout(&s, &slen);
            continue;
        }

        /*
         *   If we're in a title, and this isn't the start of a new tag,
         *   skip the character - we suppress all regular text output
         *   inside a <TITLE> ... </TITLE> sequence. 
         */
        if (stream->html_in_ignore && c != '<')
        {
            /* check for entities */
            char cbuf[50];
            if (c == '&')
            {
                /* translate the entity */
                c = out_parse_entity(cbuf, sizeof(cbuf), &s, &slen);
            }
            else
            {
                /* it's an ordinary character - copy it out literally */
                cbuf[0] = c;
                cbuf[1] = '\0';

                /* get the next character */
                c = nextout(&s, &slen);
            }

            /* 
             *   if we're gathering a title, and there's room in the title
             *   buffer for more (always leaving room for a null
             *   terminator), add this to the title buffer 
             */
            if (stream->html_in_title)
            {
                char *cbp;
                for (cbp = cbuf ; *cbp != '\0' ; ++cbp)
                {
                    /* if there's room, add it */
                    if (stream->html_title_ptr + 1 <
                        stream->html_title_buf
                        + sizeof(stream->html_title_buf))
                        *stream->html_title_ptr++ = *cbp;
                }
            }

            /* don't display anything in an ignore section */
            continue;
        }
        
        if ( c == '%' )                              /* translation string? */
        {
            infmt = 1;
            f = fmsbuf;
        }
        else if ( c == '\\' )                       /* special escape code? */
        {
            c = nextout(&s, &slen);
            
            if (stream->capturing && c != '^' && c != 'v' && c != '\0')
            {
                outchar_stream(stream, '\\');
                outchar_stream(stream, c);

                /* keep the \- and also put out the next two chars */
                if (c == '-')
                {
                    outchar_stream(stream, nextout(&s, &slen));
                    outchar_stream(stream, nextout(&s, &slen));
                }
            }
            else
            {
                switch(c)
                {
                case 'H':                                /* HTML mode entry */
                    /* turn on HTML mode in the renderer */
                    switch(c = nextout(&s, &slen))
                    {
                    case '-':
                        /* if we have an HTML target, notify it */
                        if (stream->html_target)
                        {
                            /* flush its stream */
                            outflushn_stream(stream, 0);

                            /* tell the OS layer to switch to normal mode */
                            out_end_html(stream);
                        }

                        /* switch to normal mode */
                        stream->html_mode = FALSE;
                        break;

                    case '+':
                    default:
                        /* if we have an HTML target, notify it */
                        if (stream->html_target)
                        {
                            /* flush the underlying stream */
                            outflushn_stream(stream, 0);

                            /* tell the OS layer to switch to HTML mode */
                            out_start_html(stream);
                        }
                        
                        /* switch to HTML mode */
                        stream->html_mode = TRUE;

                        /* 
                         *   if the character wasn't a "+", it's not part
                         *   of the "\H" sequence, so display it normally 
                         */
                        if (c != '+' && c != 0)
                            outchar_stream(stream, c);
                        break;
                    }

                    /* this sequence doesn't result in any actual output */
                    break;

                case 'n':                                       /* newline? */
                    outflushn_stream(stream, 1);        /* yes, output line */
                    break;
                    
                case 't':                                           /* tab? */
                    outtab_stream(stream);
                    break;
                    
                case 'b':                                    /* blank line? */
                    outblank_stream(stream);
                    break;
                    
                case '\0':                               /* line ends here? */
                    done = 1;
                    break;

                case ' ':                                   /* quoted space */
                    if (stream->html_target && stream->html_mode)
                    {
                        /* 
                         *   we're generating for an HTML target and we're
                         *   in HTML mode - generate the HTML non-breaking
                         *   space 
                         */
                        outstring_stream(stream, "&nbsp;");
                    }
                    else
                    {
                        /* 
                         *   we're not in HTML mode - generate our
                         *   internal quoted space character 
                         */
                        outchar_stream(stream, QSPACE);
                    }
                    break;

                case '^':                      /* capitalize next character */
                    stream->capsflag = 1;
                    stream->nocapsflag = 0;
                    break;

                case 'v':
                    stream->nocapsflag = 1;
                    stream->capsflag = 0;
                    break;

                case '(':
                    /* generate HTML if in the appropriate mode */
                    if (stream->html_mode && stream->html_target)
                    {
                        /* send HTML to the renderer */
                        outstring_stream(stream, "<B>");
                    }
                    else
                    {
                        /* turn on the 'hilite' attribute */
                        stream->cur_attr |= OS_ATTR_HILITE;
                    }
                    break;

                case ')':
                    /* generate HTML if in the appropriate mode */
                    if (stream->html_mode && stream->html_target)
                    {
                        /* send HTML to the renderer */
                        outstring_stream(stream, "</B>");
                    }
                    else
                    {
                        /* turn off the 'hilite' attribute */
                        stream->cur_attr &= ~OS_ATTR_HILITE;
                    }
                    break;

                case '-':
                    outchar_stream(stream, nextout(&s, &slen));
                    outchar_stream(stream, nextout(&s, &slen));
                    break;
                    
                default:                 /* just pass invalid escapes as-is */
                    outchar_stream(stream, c);
                    break;
                }
            }
        }
        else if (!stream->html_target
                 && stream->html_mode
                 && (c == '<' || c == '&'))
        {
            /*
             *   We're in HTML mode, but the underlying target does not
             *   accept HTML sequences.  It appears we're at the start of
             *   an "&" entity or a tag sequence, so parse it, remove it,
             *   and replace it (if possible) with a text-only equivalent. 
             */
            if (c == '<')
            {
                /* read the tag */
                char tagbuf[50];
                int is_end_tag;
                c = read_tag(tagbuf, sizeof(tagbuf), &is_end_tag,
                             &s, &slen, 0);

                /*
                 *   Check to see if we recognize the tag.  We only
                 *   recognize a few simple tags that map easily to
                 *   character mode. 
                 */
                if (!stricmp(tagbuf, "br"))
                {
                    /* 
                     *   line break - if there's anything buffered up,
                     *   just flush the current line, otherwise write out
                     *   a blank line 
                     */
                    if (stream->html_in_ignore)
                        /* suppress breaks in ignore mode */;
                    else if (stream->linepos != 0)
                        stream->html_defer_br = HTML_DEFER_BR_FLUSH;
                    else
                        stream->html_defer_br = HTML_DEFER_BR_BLANK;
                }
                else if (!stricmp(tagbuf, "b")
                         || !stricmp(tagbuf, "i")
                         || !stricmp(tagbuf, "em")
                         || !stricmp(tagbuf, "strong"))
                {
                    int attr;
                    
                    /* choose the attribute flag */
                    switch (tagbuf[0])
                    {
                    case 'b':
                    case 'B':
                        attr = OS_ATTR_BOLD;
                        break;

                    case 'i':
                    case 'I':
                        attr = OS_ATTR_ITALIC;
                        break;

                    case 'e':
                    case 'E':
                        attr = OS_ATTR_EM;
                        break;

                    case 's':
                    case 'S':
                        attr = OS_ATTR_STRONG;
                        break;
                    }
                    
                    /* bold on/off - send out appropriate os-layer code */
                    if (stream->html_in_ignore)
                    {
                        /* suppress any change in 'ignore' mode */
                    }
                    else if (!is_end_tag)
                    {
                        /* turn on the selected attribute */
                        stream->cur_attr |= attr;
                    }
                    else
                    {
                        /* turn off the selected attribute */
                        stream->cur_attr &= ~attr;
                    }
                }
                else if (!stricmp(tagbuf, "p"))
                {
                    /* paragraph - send out a blank line */
                    if (!stream->html_in_ignore)
                        outblank_stream(stream);
                }
                else if (!stricmp(tagbuf, "tab"))
                {
                    /* tab - send out a \t */
                    if (!stream->html_in_ignore)
                        outtab_stream(stream);
                }
                else if (!stricmp(tagbuf, "img") || !stricmp(tagbuf, "sound"))
                {
                    /* IMG and SOUND - allow ALT attributes */
                    stream->html_allow_alt = TRUE;
                }
                else if (!stricmp(tagbuf, "hr"))
                {
                    int rem;
                    
                    if (!stream->html_in_ignore)
                    {
                        /* start a new line */
                        outflushn_stream(stream, 1);

                        /* write out underscores to the display width */
                        for (rem = G_os_linewidth - 1 ; rem > 0 ; )
                        {
                            char dashbuf[100];
                            int cur;
                            
                            /* do as much as we can on this pass */
                            cur = rem;
                            if ((size_t)cur > sizeof(dashbuf) - 1)
                                cur = sizeof(dashbuf) - 1;
                            
                            /* do a buffer-full of dashes */
                            memset(dashbuf, '_', cur);
                            dashbuf[cur] = '\0';
                            outstring_stream(stream, dashbuf);
                            
                            /* deduct this from the total */
                            rem -= cur;
                        }

                        /* put a blank line after the underscores */
                        outblank_stream(stream);
                    }
                }
                else if (!stricmp(tagbuf, "q"))
                {
                    unsigned int htmlchar;

                    if (!stream->html_in_ignore)
                    {
                        /* if it's an open quote, increment the level */
                        if (!is_end_tag)
                            ++(stream->html_quote_level);
                        
                        /* add the open quote */
                        htmlchar =
                            (!is_end_tag
                             ? ((stream->html_quote_level & 1) == 1
                                ? 8220 : 8216)
                             : ((stream->html_quote_level & 1) == 1
                                ? 8221 : 8217));
                        
                        /* 
                         *   write out the HTML character, translated to
                         *   the local character set 
                         */
                        outchar_html_stream(stream, htmlchar);
                        
                        /* if it's a close quote, decrement the level */
                        if (is_end_tag)
                            --(stream->html_quote_level);
                    }
                }
                else if (!stricmp(tagbuf, "title"))
                {
                    /* 
                     *   Turn ignore mode on or off as appropriate, and
                     *   turn on or off title mode as well.
                     */
                    if (is_end_tag)
                    {
                        /* 
                         *   note that we're leaving an ignore section and
                         *   a title section 
                         */
                        --(stream->html_in_ignore);
                        --(stream->html_in_title);

                        /* 
                         *   if we're no longer in a title, call the OS
                         *   layer to tell it the title string, in case it
                         *   wants to change the window title or otherwise
                         *   make use of the title 
                         */
                        if (stream->html_in_title == 0)
                        {
                            /* null-terminate the title string */
                            *stream->html_title_ptr = '\0';
                            
                            /* tell the OS about the title */
                            os_set_title(stream->html_title_buf);
                        }
                    }
                    else
                    {
                        /* 
                         *   if we aren't already in a title, set up to
                         *   capture the title into the title buffer 
                         */
                        if (!stream->html_in_title)
                            stream->html_title_ptr = stream->html_title_buf;

                        /* 
                         *   note that we're in a title and in an ignore
                         *   section, since nothing within gets displayed 
                         */
                        ++(stream->html_in_ignore);
                        ++(stream->html_in_title);
                    }
                }
                else if (!stricmp(tagbuf, "aboutbox"))
                {
                    /* turn ignore mode on or off as appropriate */
                    if (is_end_tag)
                        --(stream->html_in_ignore);
                    else
                        ++(stream->html_in_ignore);
                }
                else if (!stricmp(tagbuf, "pre"))
                {
                    /* count the nesting level if starting PRE mode */
                    if (!is_end_tag)
                        stream->html_pre_level += 1;

                    /* surround the PRE block with line breaks */
                    outblank_stream(stream);

                    /* count the nesting level if ending PRE mode */
                    if (is_end_tag && stream->html_pre_level != 0)
                        stream->html_pre_level -= 1;
                }

                /* suppress everything up to the next '>' */
                stream->html_mode_flag = HTML_MODE_TAG;

                /* 
                 *   continue with the current character; since we're in
                 *   html tag mode, we'll skip everything until we get to
                 *   the closing '>' 
                 */
                continue;
            }
            else if (c == '&')
            {
                /* parse it */
                char  xlat_buf[50];
                c = out_parse_entity(xlat_buf, sizeof(xlat_buf), &s, &slen);

                /* write it out (we've already translated it) */
                outstring_noxlat_stream(stream, xlat_buf);
                
                /* proceed with the next character */
                continue;
            }
        }
        else if (stream->html_target && stream->html_mode && c == '<')
        {
            /*
             *   We're in HTML mode, and we have an underlying HTML target.
             *   We don't need to do much HTML interpretation at this level.
             *   However, we do need to keep track of when we're in a PRE
             *   block, so that we can pass whitespaces and newlines through
             *   to the underlying HTML engine without filtering when we're
             *   in preformatted text. 
             */
            char tagbuf[50];
            int is_end_tag;
            c = read_tag(tagbuf, sizeof(tagbuf), &is_end_tag,
                         &s, &slen, stream);

            /* check for special tags */
            if (!stricmp(tagbuf, "pre"))
            {
                /* count the nesting level */
                if (!is_end_tag)
                    stream->html_pre_level += 1;
                else if (is_end_tag && stream->html_pre_level != 0)
                    stream->html_pre_level -= 1;
            }

            /* copy the last character after the tag to the stream */
            if (c != 0)
                outchar_stream(stream, c);
        }
        else
        {
            /* normal character */
            outchar_stream(stream, c);
        }

        /* move on to the next character, unless we're finished */
        if (done)
            c = '\0';
        else
            c = nextout(&s, &slen);
    }

    /* if we ended up inside what looked like a format string, dump string */
    if (infmt)
    {
        outchar_stream(stream, '%');
        for (f1 = fmsbuf ; f1 < f ; ++f1)
            outchar_stream(stream, *f1);
    }

    /* exit a recursion level */
    out_pop_stream();

    /* success */
    return 0;
}